

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O3

void __thiscall QtMWidgets::TableViewCellLayout::setGeometry(TableViewCellLayout *this,QRect *rect)

{
  int *piVar1;
  qsizetype qVar2;
  char cVar3;
  int iVar4;
  ulong uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  QRect *pQVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  QRect r;
  QString local_80;
  QRect local_68;
  int local_54;
  QString local_50;
  ulong local_38;
  
  QLayout::setGeometry((QRect *)this);
  auVar13 = QLayout::contentsMargins();
  local_68.x1 = rect->x1 + auVar13._0_4_;
  local_68.x2 = rect->x2 - auVar13._8_4_;
  local_68.y1 = auVar13._4_4_ + rect->y1;
  local_68.y2 = rect->y2 - auVar13._12_4_;
  uVar5 = (**(code **)(*(long *)this->accessoryWidget + 0x70))();
  QLabel::pixmap();
  cVar3 = QPixmap::isNull();
  iVar8 = (int)(uVar5 >> 0x20);
  iVar7 = (int)uVar5;
  if (cVar3 == '\0') {
    QLabel::text();
    qVar2 = local_50.d.size;
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,8);
      }
    }
    QPixmap::~QPixmap((QPixmap *)&local_80);
    if (qVar2 != 0) goto LAB_0015fd0e;
    iVar9 = local_68.x1;
    iVar10 = local_68.y1;
    local_80.d.d._0_4_ = local_68.x1;
    local_80.d.d._4_4_ = local_68.y1;
    local_80.d.ptr._0_4_ = local_68.x1 + -1;
    local_80.d.ptr._4_4_ = local_68.y1 + -1;
    QWidget::setGeometry((QRect *)this->imageLabel);
    iVar4 = 0;
  }
  else {
    QPixmap::~QPixmap((QPixmap *)&local_80);
LAB_0015fd0e:
    if ((iVar8 == 0 || (long)uVar5 < 0) || iVar7 < 1) {
      TextLabel::text(&local_80,this->textLabel);
      if (local_80.d.size == 0) {
        TextLabel::text(&local_50,this->detailedTextLabel);
        bVar12 = local_50.d.size == 0;
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,8);
          }
        }
      }
      else {
        bVar12 = false;
      }
      piVar1 = (int *)CONCAT44(local_80.d.d._4_4_,(int)local_80.d.d);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_80.d.d._4_4_,(int)local_80.d.d),2,8);
        }
      }
      if (bVar12) {
        QWidget::setGeometry((QRect *)this->imageLabel);
        local_80.d.d._0_4_ = local_68.x1;
        local_80.d.d._4_4_ = local_68.y1;
        local_80.d.ptr._0_4_ = local_68.x1 + -1;
        local_80.d.ptr._4_4_ = local_68.y1 + -1;
        QWidget::setGeometry((QRect *)this->textLabel);
        local_80.d.d._0_4_ = local_68.x1;
        local_80.d.d._4_4_ = local_68.y1;
        local_80.d.ptr._0_4_ = local_68.x1 + -1;
        local_80.d.ptr._4_4_ = local_68.y1 + -1;
        QWidget::setGeometry((QRect *)this->detailedTextLabel);
        pQVar11 = (QRect *)this->accessoryWidget;
        local_80.d.d._0_4_ = local_68.x1;
        local_80.d.d._4_4_ = local_68.y1;
        local_80.d.ptr._0_4_ = local_68.x1 + -1;
        local_80.d.ptr._4_4_ = local_68.y1 + -1;
        goto LAB_00160162;
      }
    }
    uVar6 = (**(code **)(*(long *)this->imageLabel + 0x70))();
    iVar9 = local_68.x1;
    iVar10 = local_68.y1;
    local_80.d.d._0_4_ = local_68.x1;
    local_80.d.d._4_4_ = local_68.y1;
    local_80.d.ptr._0_4_ = (int)uVar6 + -1 + local_68.x1;
    local_80.d.ptr._4_4_ = (int)((ulong)uVar6 >> 0x20) + local_68.y1 + -1;
    QWidget::setGeometry((QRect *)this->imageLabel);
    iVar4 = (**(code **)(*(long *)this + 0x60))(this);
    iVar4 = iVar4 + (int)uVar6;
  }
  if ((iVar8 != 0 && -1 < (long)uVar5) && 0 < iVar7) {
    local_54 = iVar4;
    TextLabel::text(&local_80,this->textLabel);
    if (local_80.d.size == 0) {
      TextLabel::text(&local_50,this->detailedTextLabel);
      bVar12 = local_50.d.size == 0;
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,8);
        }
      }
    }
    else {
      bVar12 = false;
    }
    piVar1 = (int *)CONCAT44(local_80.d.d._4_4_,(int)local_80.d.d);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_80.d.d._4_4_,(int)local_80.d.d),2,8);
      }
    }
    if (bVar12) {
      iVar9 = local_68.x1;
      iVar10 = local_68.y1;
      local_80.d.d._0_4_ = local_68.x1;
      local_80.d.d._4_4_ = local_68.y1;
      iVar7 = local_68.x1 + -1;
      iVar8 = local_68.y1 + -1;
      local_80.d.ptr._0_4_ = iVar7;
      local_80.d.ptr._4_4_ = iVar8;
      local_38 = uVar5 >> 0x20;
      QWidget::setGeometry((QRect *)this->textLabel);
      local_80.d.d._0_4_ = iVar9;
      local_80.d.d._4_4_ = iVar10;
      local_80.d.ptr._0_4_ = iVar7;
      local_80.d.ptr._4_4_ = iVar8;
      QWidget::setGeometry((QRect *)this->detailedTextLabel);
      iVar8 = (local_68.y2 - iVar10) + 1;
      iVar7 = 0;
      iVar4 = iVar8 - (int)local_38;
      if (iVar4 != 0 && (int)local_38 <= iVar8) {
        iVar7 = iVar4 / 2;
      }
      pQVar11 = (QRect *)this->accessoryWidget;
      local_80.d.d._0_4_ = iVar9 + local_54;
      local_80.d.d._4_4_ = iVar10 + iVar7;
      local_80.d.ptr._0_4_ = local_68.x2;
      local_80.d.ptr._4_4_ = local_68.y2 - iVar7;
    }
    else {
      TextLabel::text(&local_80,this->textLabel);
      bVar12 = true;
      if (local_80.d.size == 0) {
        TextLabel::text(&local_50,this->detailedTextLabel);
        bVar12 = local_50.d.size != 0;
        if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,2,8);
          }
        }
      }
      piVar1 = (int *)CONCAT44(local_80.d.d._4_4_,(int)local_80.d.d);
      if (piVar1 != (int *)0x0) {
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          QArrayData::deallocate((QArrayData *)CONCAT44(local_80.d.d._4_4_,(int)local_80.d.d),2,8);
        }
      }
      iVar9 = local_68.y1;
      if (bVar12) {
        iVar9 = (local_68.y2 - local_68.y1) + 1;
        local_80.d.ptr._4_4_ = 0;
        iVar10 = iVar9 - iVar8;
        if (iVar10 != 0 && iVar8 <= iVar9) {
          local_80.d.ptr._4_4_ = iVar10 / 2;
        }
        local_80.d.d._0_4_ = (local_68.x2 - iVar7) + 1;
        local_80.d.d._4_4_ = local_68.y1 + local_80.d.ptr._4_4_;
        local_80.d.ptr._0_4_ = local_68.x2;
        local_80.d.ptr._4_4_ = local_68.y2 - local_80.d.ptr._4_4_;
        QWidget::setGeometry((QRect *)this->accessoryWidget);
        iVar4 = local_54;
        goto LAB_0015fec1;
      }
      iVar10 = local_68.x1;
      local_80.d.d._0_4_ = local_68.x1;
      local_80.d.d._4_4_ = local_68.y1;
      iVar7 = local_68.x1 + -1;
      iVar8 = local_68.y1 + -1;
      local_80.d.ptr._0_4_ = iVar7;
      local_80.d.ptr._4_4_ = iVar8;
      QWidget::setGeometry((QRect *)this->textLabel);
      local_80.d.d._0_4_ = iVar10;
      local_80.d.d._4_4_ = iVar9;
      local_80.d.ptr._0_4_ = iVar7;
      local_80.d.ptr._4_4_ = iVar8;
      QWidget::setGeometry((QRect *)this->detailedTextLabel);
      pQVar11 = (QRect *)this->accessoryWidget;
      local_80.d.d._0_4_ = iVar10;
      local_80.d.d._4_4_ = iVar9;
      local_80.d.ptr._0_4_ = iVar7;
      local_80.d.ptr._4_4_ = iVar8;
    }
LAB_00160162:
    QWidget::setGeometry(pQVar11);
    return;
  }
  local_80.d.ptr._0_4_ = iVar9 + -1;
  local_80.d.ptr._4_4_ = iVar10 + -1;
  local_80.d.d._0_4_ = iVar9;
  local_80.d.d._4_4_ = iVar10;
  QWidget::setGeometry((QRect *)this->accessoryWidget);
  iVar7 = 0;
LAB_0015fec1:
  setTextGeometry(this,&local_68,iVar4,iVar7);
  return;
}

Assistant:

void
TableViewCellLayout::setGeometry( const QRect & rect )
{
	QLayout::setGeometry( rect );

	const QMargins m = contentsMargins();
	const QRect r = rect.adjusted( m.left(), m.top(), -m.right(), -m.bottom() );

	int imageOffset = 0;

	const QSize accessorySizeHint = accessoryWidget->sizeHint();

	if( imageLabel->pixmap( Qt::ReturnByValue ).isNull() || !imageLabel->text().isEmpty() )
	{
		if( accessorySizeHint.isEmpty() && textLabel->text().isEmpty() &&
			detailedTextLabel->text().isEmpty() )
		{
			imageLabel->setGeometry( r );
			textLabel->setGeometry( r.x(), r.y(), 0, 0 );
			detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );
			accessoryWidget->setGeometry( r.x(), r.y(), 0, 0 );

			return;
		}

		const QSize imageSize = imageLabel->sizeHint();

		imageLabel->setGeometry( r.x(), r.y(),
			imageSize.width(), imageSize.height() );

		imageOffset += imageSize.width() + spacing();
	}
	else
		imageLabel->setGeometry( r.x(), r.y(), 0, 0 );

	if( accessorySizeHint.isEmpty() )
	{
		accessoryWidget->setGeometry( r.x(), r.y(), 0, 0 );

		setTextGeometry( r, imageOffset, 0 );
	}
	else if( textLabel->text().isEmpty() && detailedTextLabel->text().isEmpty() &&
		!accessorySizeHint.isEmpty() )
	{
		textLabel->setGeometry( r.x(), r.y(), 0, 0 );
		detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );

		const int offset = ( accessorySizeHint.height() < r.height() ?
			( r.height() - accessorySizeHint.height() ) / 2 : 0 );

		accessoryWidget->setGeometry( r.x() + imageOffset, r.y() + offset,
			r.width() - imageOffset, r.height() - offset * 2 );
	}
	else if( ( !textLabel->text().isEmpty() || !detailedTextLabel->text().isEmpty() ) &&
		!accessorySizeHint.isEmpty() )
	{
		const int offset = ( accessorySizeHint.height() < r.height() ?
			( r.height() - accessorySizeHint.height() ) / 2 : 0 );

		accessoryWidget->setGeometry( r.x() + r.width() -
			accessorySizeHint.width(), r.y() + offset,
			accessorySizeHint.width(), r.height() - offset * 2 );

		setTextGeometry( r, imageOffset, accessorySizeHint.width() );
	}
	else
	{
		textLabel->setGeometry( r.x(), r.y(), 0, 0 );
		detailedTextLabel->setGeometry( r.x(), r.y(), 0, 0 );
		accessoryWidget->setGeometry( r.x(), r.y(), 0, 0 );
	}
}